

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O2

void pzshape::TPZShapeQuad::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long *plVar5;
  int iVar6;
  double *pdVar7;
  int xj;
  int iVar8;
  long lVar9;
  ulong uVar10;
  TPZFNMatrix<100,_double> *this;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  REAL out;
  TPZVec<long> ids;
  TPZManVector<double,_1> outvec;
  TPZFMatrix<double> dphin;
  TPZFMatrix<double> phin;
  REAL store1 [20];
  TPZFNMatrix<100,_double> dphiblend;
  TPZFNMatrix<100,_double> phiblend;
  REAL store2 [40];
  
  ShapeCorner(pt,phi,dphi);
  TPZFNMatrix<100,_double>::TPZFNMatrix(&phiblend,9,1);
  this = &dphiblend;
  TPZFNMatrix<100,_double>::TPZFNMatrix(this,2,9);
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    pdVar7 = TPZFMatrix<double>::operator()(phi,lVar9,0);
    dVar1 = *pdVar7;
    this = &phiblend;
    pdVar7 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar9,0);
    *pdVar7 = dVar1;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      pdVar7 = TPZFMatrix<double>::operator()(dphi,lVar11,lVar9);
      dVar1 = *pdVar7;
      this = &dphiblend;
      pdVar7 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar11,lVar9);
      *pdVar7 = dVar1;
    }
  }
  ShapeGenerating((TPZVec<double> *)this,&phiblend.super_TPZFMatrix<double>,
                  &dphiblend.super_TPZFMatrix<double>);
  lVar9 = 4;
  uVar10 = 0;
  while (uVar10 != 4) {
    out = (double)(&gRibTrans2dQ1d)[uVar10 * 2] * *pt->fStore +
          (double)(&DAT_01876148)[uVar10 * 2] * pt->fStore[1];
    TPZVec<long>::TPZVec(&ids,2);
    TPZManVector<double,_1>::TPZManVector(&outvec,1,&out);
    plVar5 = id->fStore;
    *ids.fStore = plVar5[uVar10];
    ids.fStore[1] = plVar5[(uint)(uVar10 + 1) & 3];
    uVar13 = (long)order->fStore[uVar10] - 1;
    TPZFMatrix<double>::TPZFMatrix(&phin,uVar13,1,store1,0x14);
    TPZFMatrix<double>::TPZFMatrix(&dphin,2,uVar13,store2,0x28);
    iVar8 = order->fStore[uVar10];
    iVar6 = TPZShapeLinear::GetTransformId1d(&ids);
    TPZShapeLinear::ShapeInternal(&outvec.super_TPZVec<double>,iVar8,&phin,&dphin,iVar6);
    TransformDerivativeFromRibToQuad((int)uVar10,(int)uVar13,&dphin);
    lVar9 = (long)(int)lVar9;
    uVar12 = uVar10 | 4;
    uVar14 = uVar13 & 0xffffffff;
    if ((int)uVar13 < 1) {
      uVar14 = 0;
    }
    for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
      pdVar7 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,uVar12,0);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()(&phin,uVar13,0);
      dVar2 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()(phi,lVar9,0);
      *pdVar7 = dVar1 * dVar2;
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar11,uVar12);
        dVar1 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()(&phin,uVar13,0);
        dVar2 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,uVar12,0);
        dVar3 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()(&dphin,lVar11,uVar13);
        dVar4 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()(dphi,lVar11,lVar9);
        *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
      }
      lVar9 = lVar9 + 1;
    }
    TPZFMatrix<double>::~TPZFMatrix(&dphin);
    TPZFMatrix<double>::~TPZFMatrix(&phin);
    TPZManVector<double,_1>::~TPZManVector(&outvec);
    TPZVec<long>::~TPZVec(&ids);
    uVar10 = uVar10 + 1;
  }
  iVar8 = order->fStore[4] + -1;
  uVar10 = (ulong)(uint)(iVar8 * iVar8);
  TPZFMatrix<double>::TPZFMatrix(&phin,uVar10,1,store1,0x14);
  TPZFMatrix<double>::TPZFMatrix(&dphin,2,uVar10,store2,0x28);
  iVar8 = order->fStore[4];
  iVar6 = GetTransformId2dQ(id);
  ShapeInternal(pt,iVar8 + -2,&phin,&dphin,iVar6);
  lVar9 = (long)(int)lVar9;
  for (uVar12 = 0; uVar12 != uVar10; uVar12 = uVar12 + 1) {
    pdVar7 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,8,0);
    dVar1 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()(&phin,uVar12,0);
    dVar2 = *pdVar7;
    pdVar7 = TPZFMatrix<double>::operator()(phi,lVar9,0);
    *pdVar7 = dVar1 * dVar2;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      pdVar7 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar11,8);
      dVar1 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()(&phin,uVar12,0);
      dVar2 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,8,0);
      dVar3 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()(&dphin,lVar11,uVar12);
      dVar4 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()(dphi,lVar11,lVar9);
      *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
    }
    lVar9 = lVar9 + 1;
  }
  TPZFMatrix<double>::~TPZFMatrix(&dphin);
  TPZFMatrix<double>::~TPZFMatrix(&phin);
  TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphiblend);
  TPZFNMatrix<100,_double>::~TPZFNMatrix(&phiblend);
  return;
}

Assistant:

void TPZShapeQuad::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order,
                             TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
        ShapeCorner(pt,phi,dphi);
        int is,d;
        TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
        for(is=0; is<NCornerNodes; is++)
        {
            phiblend(is,0) = phi(is,0);
            for(d=0; d<Dimension; d++)
            {
                dphiblend(d,is) = dphi(d,is);
            }
        }
        ShapeGenerating(pt,phiblend,dphiblend);
        REAL out;
        int shape = 4;
        for (int rib = 0; rib < 4; rib++) {
            
            ProjectPoint2dQuadToRib(rib,pt,out);
            TPZVec<int64_t> ids(2);
            TPZManVector<REAL,1> outvec(1,out);
            ids[0] = id[rib%4];
            ids[1] = id[(rib+1)%4];
            REAL store1[20],store2[40];
            int ord2 = order[rib]-1;//two orders : order in x and order in y
            TPZFMatrix<REAL> phin(ord2,1,store1,20),dphin(2,ord2,store2,40);
            TPZShapeLinear::ShapeInternal(outvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));
            TransformDerivativeFromRibToQuad(rib,ord2,dphin);
            for (int i = 0; i < ord2; i++) {
                phi(shape,0) = phiblend(rib+4,0)*phin(i,0);
                for(int xj=0;xj<2;xj++) {
                    dphi(xj,shape) = dphiblend(xj,rib+4)*phin(i,0)+
                    phiblend(rib+4,0)*dphin(xj,i);
                }
                shape++;
            }
        }
        REAL store1[20],store2[40];
        int ord = (order[4]-1)*(order[4]-1);
        TPZFMatrix<REAL> phin(ord,1,store1,20),dphin(2,ord,store2,40);
        ShapeInternal(pt,order[4]-2,phin,dphin,GetTransformId2dQ(id));
        for(int i=0;i<ord;i++)    {//funcoes de interior s�o em numero ordem-1
            phi(shape,0) = phiblend(8,0)*phin(i,0);
            for(int xj=0;xj<2;xj++) {//x e y
                dphi(xj,shape) = dphiblend(xj,8)*phin(i,0) +
                phiblend(8,0)*dphin(xj,i);
            }
            shape++;
        }
    }